

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor5_Test::TestBody(ConfidentialTxOut_Constractor5_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_768;
  Message local_760;
  int local_754;
  int64_t local_750;
  undefined1 local_748;
  Amount local_740;
  int64_t local_730;
  undefined1 local_728 [8];
  AssertionResult gtest_ar_6;
  Message local_710;
  ByteData local_708;
  string local_6f0;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_5;
  Message local_6b8;
  ByteData local_6b0;
  string local_698;
  undefined1 local_678 [8];
  AssertionResult gtest_ar_4;
  Message local_660;
  ConfidentialNonce local_658;
  string local_630;
  undefined1 local_610 [8];
  AssertionResult gtest_ar_3;
  Message local_5f8;
  Script local_5f0;
  string local_5b8;
  undefined1 local_598 [8];
  AssertionResult gtest_ar_2;
  Message local_580;
  int64_t local_578;
  int64_t local_570;
  undefined1 local_568;
  ConfidentialValue local_560;
  Amount local_538;
  int64_t local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_1;
  Message local_508;
  string local_500;
  ConfidentialAssetId local_4e0;
  string local_4b8;
  undefined1 local_498 [8];
  AssertionResult gtest_ar;
  undefined1 local_310 [8];
  ConfidentialTxOut txout;
  undefined1 local_208 [8];
  Amount amount;
  allocator local_1e1;
  string local_1e0;
  undefined1 local_1c0 [8];
  ElementsConfidentialAddress address;
  ConfidentialTxOut_Constractor5_Test *this_local;
  
  address.address_.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e0,
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,&local_1e1);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  txout.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)AVar3.amount_;
  amount.amount_._0_1_ = AVar3.ignore_check_;
  local_208 = (undefined1  [8])
              txout.range_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
            ((Address *)&gtest_ar.message_,(ElementsConfidentialAddress *)local_1c0);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_310,(Address *)&gtest_ar.message_,&exp_asset,
             (Amount *)local_208);
  cfd::core::Address::~Address((Address *)&gtest_ar.message_);
  cfd::core::ConfidentialTxOut::GetAsset(&local_4e0,(ConfidentialTxOut *)local_310);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4b8,&local_4e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_500,&exp_asset);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_498,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4b8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_4e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  cfd::core::ConfidentialTxOut::GetConfidentialValue(&local_560,(ConfidentialTxOut *)local_310);
  AVar3 = cfd::core::ConfidentialValue::GetAmount(&local_560);
  local_570 = AVar3.amount_;
  local_568 = AVar3.ignore_check_;
  local_538.amount_ = local_570;
  local_538.ignore_check_ = (bool)local_568;
  local_528 = cfd::core::Amount::GetSatoshiValue(&local_538);
  local_578 = cfd::core::Amount::GetSatoshiValue((Amount *)local_208);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_520,
             "txout.GetConfidentialValue().GetAmount().GetSatoshiValue()","amount.GetSatoshiValue()"
             ,&local_528,&local_578);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_560);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  cfd::core::AbstractTxOut::GetLockingScript(&local_5f0,(AbstractTxOut *)local_310);
  cfd::core::Script::GetHex_abi_cxx11_(&local_5b8,&local_5f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_598,"txout.GetLockingScript().GetHex().c_str()",
             "\"0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",pcVar2,
             "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  std::__cxx11::string::~string((string *)&local_5b8);
  cfd::core::Script::~Script(&local_5f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  cfd::core::ConfidentialTxOut::GetNonce(&local_658,(ConfidentialTxOut *)local_310);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_630,&local_658);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_610,"txout.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_630);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_660);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_6b0,(ConfidentialTxOut *)local_310);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_698,&local_6b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_678,"txout.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_698);
  cfd::core::ByteData::~ByteData(&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_678);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_678);
  cfd::core::ConfidentialTxOut::GetSurjectionProof(&local_708,(ConfidentialTxOut *)local_310);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_6f0,&local_708);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6d0,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_6f0);
  cfd::core::ByteData::~ByteData(&local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_710);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  AVar3 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)local_310);
  local_750 = AVar3.amount_;
  local_748 = AVar3.ignore_check_;
  local_740.amount_ = local_750;
  local_740.ignore_check_ = (bool)local_748;
  local_730 = cfd::core::Amount::GetSatoshiValue(&local_740);
  local_754 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_728,"txout.GetValue().GetSatoshiValue()","0",&local_730,
             &local_754);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_728);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_728);
    testing::internal::AssertHelper::AssertHelper
              (&local_768,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_768,&local_760);
    testing::internal::AssertHelper::~AssertHelper(&local_768);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_728);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_310);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1c0);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor5) {
  // ConfidentialAssetId, ConfidentialValue
  ElementsConfidentialAddress address("el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz");
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(address.GetUnblindedAddress(), exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
      "0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}